

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O3

boolean encode_mcu(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_encoder *pjVar2;
  JBLOCKROW paJVar3;
  jpeg_component_info *pjVar4;
  bool bVar5;
  ushort uVar6;
  long lVar7;
  uint uVar8;
  int *piVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  _func_void_j_compress_ptr *p_Var15;
  code *pcVar16;
  _func_void_j_compress_ptr *st;
  ushort uVar17;
  uint uVar18;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *p_Var19;
  ulong uVar20;
  undefined4 uVar21;
  uint uVar22;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    uVar8 = *(uint *)&pjVar2[4].start_pass;
    if (uVar8 == 0) {
      emit_restart(cinfo,*(int *)((long)&pjVar2[4].start_pass + 4));
      uVar8 = cinfo->restart_interval;
      *(uint *)((long)&pjVar2[4].start_pass + 4) =
           *(int *)((long)&pjVar2[4].start_pass + 4) + 1U & 7;
    }
    *(uint *)&pjVar2[4].start_pass = uVar8 - 1;
  }
  if (cinfo->blocks_in_MCU < 1) {
    return 1;
  }
  lVar7 = 0;
LAB_001123aa:
  paJVar3 = MCU_data[lVar7];
  lVar13 = (long)cinfo->MCU_membership[lVar7];
  pjVar4 = cinfo->cur_comp_info[lVar13];
  iVar1 = pjVar4->dc_tbl_no;
  p_Var19 = (&pjVar2[4].encode_mcu)[iVar1] + *(int *)((long)&pjVar2[3].encode_mcu + lVar13 * 4);
  iVar10 = (int)(*paJVar3)[0] - *(int *)((long)&pjVar2[2].finish_pass + lVar13 * 4);
  if (iVar10 == 0) {
    arith_encode(cinfo,(uchar *)p_Var19,0);
    *(undefined4 *)((long)&pjVar2[3].encode_mcu + lVar13 * 4) = 0;
  }
  else {
    *(int *)((long)&pjVar2[2].finish_pass + lVar13 * 4) = (int)(*paJVar3)[0];
    arith_encode(cinfo,(uchar *)p_Var19,1);
    uVar8 = 0;
    bVar5 = iVar10 < 1;
    if (bVar5) {
      iVar10 = -iVar10;
      uVar21 = 8;
      lVar14 = 3;
    }
    else {
      uVar21 = 4;
      lVar14 = 2;
    }
    arith_encode(cinfo,(uchar *)(p_Var19 + 1),(uint)bVar5);
    p_Var19 = p_Var19 + lVar14;
    *(undefined4 *)((long)&pjVar2[3].encode_mcu + lVar13 * 4) = uVar21;
    uVar11 = iVar10 - 1;
    if (uVar11 != 0) {
      uVar8 = 1;
      arith_encode(cinfo,(uchar *)p_Var19,1);
      p_Var19 = (&pjVar2[4].encode_mcu)[iVar1] + 0x14;
      if (uVar11 != 1) {
        uVar8 = 1;
        uVar18 = uVar11;
        do {
          arith_encode(cinfo,(uchar *)p_Var19,1);
          uVar8 = uVar8 * 2;
          p_Var19 = p_Var19 + 1;
          bVar5 = 3 < uVar18;
          uVar18 = uVar18 >> 1;
        } while (bVar5);
      }
    }
    iVar10 = 0;
    arith_encode(cinfo,(uchar *)p_Var19,0);
    if ((int)uVar8 < (int)((ulong)(1L << (cinfo->arith_dc_L[iVar1] & 0x3f)) >> 1)) {
LAB_0011251c:
      *(int *)((long)&pjVar2[3].encode_mcu + lVar13 * 4) = iVar10;
    }
    else if ((int)((ulong)(1L << (cinfo->arith_dc_U[iVar1] & 0x3f)) >> 1) < (int)uVar8) {
      iVar10 = *(int *)((long)&pjVar2[3].encode_mcu + lVar13 * 4) + 8;
      goto LAB_0011251c;
    }
    if (1 < uVar8) {
      do {
        uVar8 = (int)uVar8 >> 1;
        arith_encode(cinfo,(uchar *)(p_Var19 + 0xe),(uint)((uVar8 & uVar11) != 0));
      } while (1 < uVar8);
    }
  }
  iVar1 = pjVar4->ac_tbl_no;
  uVar20 = 0x3f;
  do {
    uVar8 = (uint)uVar20;
    if ((*paJVar3)[jpeg_natural_order[uVar20]] != 0) {
      if (0 < (int)uVar8) {
        iVar10 = 1;
        goto LAB_001125a2;
      }
      break;
    }
    uVar20 = (ulong)(uVar8 - 1);
  } while (1 < uVar8);
  iVar10 = 1;
  goto LAB_00112775;
LAB_001125a2:
  do {
    p_Var15 = (&pjVar2[9].finish_pass)[iVar1] + (iVar10 * 3 + -3);
    arith_encode(cinfo,(uchar *)p_Var15,0);
    uVar17 = (*paJVar3)[jpeg_natural_order[iVar10]];
    iVar12 = iVar10;
    if (uVar17 == 0) {
      piVar9 = jpeg_natural_order + iVar10;
      do {
        piVar9 = piVar9 + 1;
        arith_encode(cinfo,(uchar *)(p_Var15 + 1),0);
        p_Var15 = p_Var15 + 3;
        uVar17 = (*paJVar3)[*piVar9];
        iVar10 = iVar10 + 1;
        iVar12 = iVar10;
      } while (uVar17 == 0);
    }
    arith_encode(cinfo,(uchar *)(p_Var15 + 1),1);
    uVar6 = -uVar17;
    if (0 < (short)uVar17) {
      uVar6 = uVar17;
    }
    arith_encode(cinfo,(uchar *)(pjVar2 + 0xf),(uint)((short)uVar17 < 1));
    pcVar16 = p_Var15 + 2;
    uVar11 = uVar6 - 1;
    if ((uVar11 == 0) || (arith_encode(cinfo,(uchar *)pcVar16,1), uVar11 == 1)) {
      arith_encode(cinfo,(uchar *)pcVar16,0);
    }
    else {
      arith_encode(cinfo,(uchar *)pcVar16,1);
      lVar13 = 0xbd;
      if ((int)(uint)cinfo->arith_ac_K[iVar1] < iVar12) {
        lVar13 = 0xd9;
      }
      p_Var15 = (&pjVar2[9].finish_pass)[iVar1] + lVar13;
      uVar18 = (int)uVar11 >> 1;
      if (uVar18 < 2) {
        arith_encode(cinfo,(uchar *)p_Var15,0);
        pcVar16 = p_Var15 + 0xe;
        uVar22 = 2;
      }
      else {
        uVar22 = 2;
        do {
          st = p_Var15;
          arith_encode(cinfo,(uchar *)st,1);
          uVar22 = uVar22 * 2;
          uVar18 = (int)uVar18 >> 1;
          p_Var15 = st + 1;
        } while (1 < uVar18);
        arith_encode(cinfo,(uchar *)(st + 1),0);
        if (uVar22 == 0) goto LAB_00112751;
        pcVar16 = st + 0xf;
      }
      do {
        uVar22 = (int)uVar22 >> 1;
        arith_encode(cinfo,(uchar *)pcVar16,(uint)((uVar22 & uVar11) != 0));
      } while (1 < uVar22);
    }
LAB_00112751:
    iVar10 = iVar12 + 1;
  } while (iVar12 < (int)uVar8);
  if (iVar12 < 0x3f) {
LAB_00112775:
    arith_encode(cinfo,(uchar *)((&pjVar2[9].finish_pass)[iVar1] + (iVar10 * 3 + -3)),1);
  }
  lVar7 = lVar7 + 1;
  if (cinfo->blocks_in_MCU <= lVar7) {
    return 1;
  }
  goto LAB_001123aa;
}

Assistant:

METHODDEF(boolean)
encode_mcu(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  jpeg_component_info *compptr;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, k, ke;
  int v, v2, m;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Sections F.1.4.1 & F.1.4.4.1: Encoding of DC coefficients */

    tbl = compptr->dc_tbl_no;

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.4: Encode_DC_DIFF */
    if ((v = (*block)[0] - entropy->last_dc_val[ci]) == 0) {
      arith_encode(cinfo, st, 0);
      entropy->dc_context[ci] = 0;      /* zero diff category */
    } else {
      entropy->last_dc_val[ci] = (*block)[0];
      arith_encode(cinfo, st, 1);
      /* Figure F.6: Encoding nonzero value v */
      /* Figure F.7: Encoding the sign of v */
      if (v > 0) {
        arith_encode(cinfo, st + 1, 0); /* Table F.4: SS = S0 + 1 */
        st += 2;                        /* Table F.4: SP = S0 + 2 */
        entropy->dc_context[ci] = 4;    /* small positive diff category */
      } else {
        v = -v;
        arith_encode(cinfo, st + 1, 1); /* Table F.4: SS = S0 + 1 */
        st += 3;                        /* Table F.4: SN = S0 + 3 */
        entropy->dc_context[ci] = 8;    /* small negative diff category */
      }
      /* Figure F.8: Encoding the magnitude category of v */
      m = 0;
      if (v -= 1) {
        arith_encode(cinfo, st, 1);
        m = 1;
        v2 = v;
        st = entropy->dc_stats[tbl] + 20; /* Table F.4: X1 = 20 */
        while (v2 >>= 1) {
          arith_encode(cinfo, st, 1);
          m <<= 1;
          st += 1;
        }
      }
      arith_encode(cinfo, st, 0);
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int)((1L << cinfo->arith_dc_L[tbl]) >> 1))
        entropy->dc_context[ci] = 0;    /* zero diff category */
      else if (m > (int)((1L << cinfo->arith_dc_U[tbl]) >> 1))
        entropy->dc_context[ci] += 8;   /* large diff category */
      /* Figure F.9: Encoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
        arith_encode(cinfo, st, (m & v) ? 1 : 0);
    }

    /* Sections F.1.4.2 & F.1.4.4.2: Encoding of AC coefficients */

    tbl = compptr->ac_tbl_no;

    /* Establish EOB (end-of-block) index */
    for (ke = DCTSIZE2 - 1; ke > 0; ke--)
      if ((*block)[jpeg_natural_order[ke]]) break;

    /* Figure F.5: Encode_AC_Coefficients */
    for (k = 1; k <= ke; k++) {
      st = entropy->ac_stats[tbl] + 3 * (k - 1);
      arith_encode(cinfo, st, 0);       /* EOB decision */
      while ((v = (*block)[jpeg_natural_order[k]]) == 0) {
        arith_encode(cinfo, st + 1, 0);  st += 3;  k++;
      }
      arith_encode(cinfo, st + 1, 1);
      /* Figure F.6: Encoding nonzero value v */
      /* Figure F.7: Encoding the sign of v */
      if (v > 0) {
        arith_encode(cinfo, entropy->fixed_bin, 0);
      } else {
        v = -v;
        arith_encode(cinfo, entropy->fixed_bin, 1);
      }
      st += 2;
      /* Figure F.8: Encoding the magnitude category of v */
      m = 0;
      if (v -= 1) {
        arith_encode(cinfo, st, 1);
        m = 1;
        v2 = v;
        if (v2 >>= 1) {
          arith_encode(cinfo, st, 1);
          m <<= 1;
          st = entropy->ac_stats[tbl] +
               (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
          while (v2 >>= 1) {
            arith_encode(cinfo, st, 1);
            m <<= 1;
            st += 1;
          }
        }
      }
      arith_encode(cinfo, st, 0);
      /* Figure F.9: Encoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
        arith_encode(cinfo, st, (m & v) ? 1 : 0);
    }
    /* Encode EOB decision only if k <= DCTSIZE2 - 1 */
    if (k <= DCTSIZE2 - 1) {
      st = entropy->ac_stats[tbl] + 3 * (k - 1);
      arith_encode(cinfo, st, 1);
    }
  }

  return TRUE;
}